

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_CommandLineArguments_setCompleteExcludeGroupDotNameFilter_TestShell::createTest
          (TEST_CommandLineArguments_setCompleteExcludeGroupDotNameFilter_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                                  ,0xf6);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_00340f80;
  return this_00;
}

Assistant:

TEST(CommandLineArguments, setCompleteExcludeGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xt", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}